

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# information_flow.c
# Opt level: O2

double inform_information_flow
                 (int *src,int *dst,int *back,size_t l_src,size_t l_dst,size_t l_back,size_t n,
                 size_t m,int b,inform_error *err)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  inform_error iVar5;
  long lVar6;
  _Bool _Var7;
  void *__ptr;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  int *piVar18;
  size_t sVar19;
  int iVar20;
  int iVar21;
  size_t sVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int qbs;
  int iVar27;
  size_t n_00;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  int qs;
  int *local_88;
  long local_60;
  int local_38;
  int local_34;
  
  if (((src == (int *)0x0 || l_src == 0) || (dst == (int *)0x0 || l_dst == 0)) ||
     (l_back != 0 && back == (int *)0x0)) {
    if (err == (inform_error *)0x0) {
      return NAN;
    }
    iVar5 = INFORM_ETIMESERIES;
    goto LAB_001041d6;
  }
  if (n == 0) {
    if (err == (inform_error *)0x0) {
      return NAN;
    }
    iVar5 = INFORM_ENOINITS;
    goto LAB_001041d6;
  }
  if (m == 0) {
    if (err == (inform_error *)0x0) {
      return NAN;
    }
    iVar5 = INFORM_ESHORTSERIES;
    goto LAB_001041d6;
  }
  if (b < 2) {
    if (err == (inform_error *)0x0) {
      return NAN;
    }
    iVar5 = INFORM_EBASE;
    goto LAB_001041d6;
  }
  n_00 = m * n;
  lVar11 = 0;
  do {
    if (n_00 * l_src - lVar11 == 0) {
      lVar11 = 0;
      goto LAB_00104268;
    }
    piVar9 = src + lVar11;
    if (b <= *piVar9) goto LAB_001042b8;
    lVar11 = lVar11 + 1;
  } while (-1 < *piVar9);
  goto LAB_0010427e;
  while( true ) {
    piVar9 = dst + lVar11;
    if (b <= *piVar9) goto LAB_001042b8;
    lVar11 = lVar11 + 1;
    if (*piVar9 < 0) break;
LAB_00104268:
    if (n_00 * l_dst - lVar11 == 0) {
      if (back == (int *)0x0) goto LAB_0010456d;
      lVar11 = 0;
      goto LAB_001042a0;
    }
  }
  goto LAB_0010427e;
LAB_001042b8:
  if (err == (inform_error *)0x0) {
    return NAN;
  }
  iVar5 = INFORM_EBADSTATE;
  goto LAB_001041d6;
  while (lVar11 = lVar11 + 1, -1 < *piVar9) {
LAB_001042a0:
    if (n_00 * l_back - lVar11 == 0) {
      if (l_back == 0) {
LAB_0010456d:
        lVar11 = l_src + n_00 * 2;
        piVar9 = (int *)malloc((lVar11 + l_dst) * 4);
        if (piVar9 != (int *)0x0) {
          piVar17 = piVar9 + n_00 * 2;
          iVar27 = 1;
          for (sVar13 = 0; l_src != sVar13; sVar13 = sVar13 + 1) {
            iVar27 = iVar27 * b;
            piVar17[sVar13] = b;
          }
          iVar20 = 1;
          for (sVar13 = 0; l_dst != sVar13; sVar13 = sVar13 + 1) {
            iVar20 = iVar20 * b;
            piVar9[lVar11 + sVar13] = b;
          }
          inform_black_box(src,l_src,n,m,piVar17,(size_t *)0x0,(size_t *)0x0,piVar9,err);
          _Var7 = inform_failed(err);
          if (!_Var7) {
            inform_black_box(dst,l_dst,n,m,piVar17 + l_src,(size_t *)0x0,(size_t *)0x0,piVar9 + n_00
                             ,err);
            _Var7 = inform_failed(err);
            if (!_Var7) {
              local_38 = iVar27;
              local_34 = iVar20;
              dVar32 = inform_mutual_info(piVar9,2,n_00,&local_38,err);
              free(piVar9);
              return dVar32;
            }
            return NAN;
          }
          return NAN;
        }
      }
      else {
        dVar32 = (double)b;
        auVar38._8_4_ = (int)(l_src >> 0x20);
        auVar38._0_8_ = l_src;
        auVar38._12_4_ = 0x45300000;
        dVar33 = pow(dVar32,(auVar38._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)l_src) - 4503599627370496.0));
        uVar28 = (long)(dVar33 - 9.223372036854776e+18) & (long)dVar33 >> 0x3f | (long)dVar33;
        auVar34._8_4_ = (int)(l_dst >> 0x20);
        auVar34._0_8_ = l_dst;
        auVar34._12_4_ = 0x45300000;
        dVar33 = pow(dVar32,(auVar34._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)l_dst) - 4503599627370496.0));
        uVar15 = (long)(dVar33 - 9.223372036854776e+18) & (long)dVar33 >> 0x3f | (long)dVar33;
        auVar35._8_4_ = (int)(l_back >> 0x20);
        auVar35._0_8_ = l_back;
        auVar35._12_4_ = 0x45300000;
        dVar32 = pow(dVar32,(auVar35._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)l_back) - 4503599627370496.0));
        uVar12 = (long)(dVar32 - 9.223372036854776e+18) & (long)dVar32 >> 0x3f | (long)dVar32;
        lVar25 = uVar12 * uVar28;
        lVar11 = lVar25 * uVar15;
        lVar29 = uVar12 * uVar15;
        __ptr = calloc(uVar12 + lVar25 + lVar29 + lVar11,4);
        if (__ptr != (void *)0x0) {
          lVar25 = lVar25 * 4 + lVar11 * 4;
          lVar6 = lVar29 * 4 + lVar25;
          sVar13 = 0;
          local_88 = back;
          while( true ) {
            iVar27 = (int)uVar12;
            if (sVar13 == n) break;
            piVar9 = local_88;
            piVar17 = dst;
            piVar18 = src;
            for (sVar19 = 0; sVar19 != m; sVar19 = sVar19 + 1) {
              iVar20 = 0;
              piVar8 = piVar18;
              sVar22 = l_src;
              while (bVar31 = sVar22 != 0, sVar22 = sVar22 - 1, bVar31) {
                iVar20 = iVar20 * b + *piVar8;
                piVar8 = piVar8 + n_00;
              }
              iVar21 = 0;
              piVar8 = piVar17;
              sVar22 = l_dst;
              while (bVar31 = sVar22 != 0, sVar22 = sVar22 - 1, bVar31) {
                iVar21 = iVar21 * b + *piVar8;
                piVar8 = piVar8 + n_00;
              }
              iVar24 = 0;
              sVar22 = l_back;
              piVar8 = piVar9;
              while (bVar31 = sVar22 != 0, sVar22 = sVar22 - 1, bVar31) {
                iVar24 = iVar24 * b + *piVar8;
                piVar8 = piVar8 + n_00;
              }
              iVar21 = iVar21 * iVar27 + iVar24;
              piVar8 = (int *)((long)__ptr + (long)(iVar20 * (int)lVar29 + iVar21) * 4);
              *piVar8 = *piVar8 + 1;
              piVar8 = (int *)((long)__ptr + (long)(iVar20 * iVar27 + iVar24) * 4 + lVar11 * 4);
              *piVar8 = *piVar8 + 1;
              piVar8 = (int *)((long)__ptr + (long)iVar21 * 4 + lVar25);
              *piVar8 = *piVar8 + 1;
              piVar8 = (int *)((long)__ptr + (long)iVar24 * 4 + lVar6);
              *piVar8 = *piVar8 + 1;
              piVar18 = piVar18 + 1;
              piVar17 = piVar17 + 1;
              piVar9 = piVar9 + 1;
            }
            sVar13 = sVar13 + 1;
            src = src + m;
            dst = dst + m;
            local_88 = local_88 + m;
          }
          uVar10 = uVar28 & 0xffffffff;
          if ((int)uVar28 < 1) {
            uVar10 = 0;
          }
          local_60 = 0;
          uVar28 = uVar15 & 0xffffffff;
          if ((int)uVar15 < 1) {
            uVar28 = 0;
          }
          uVar15 = 0;
          if (0 < iVar27) {
            uVar15 = uVar12 & 0xffffffff;
          }
          dVar32 = 0.0;
          for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
            uVar1 = *(uint *)((long)__ptr + uVar14 * 4 + lVar6);
            if (uVar1 != 0) {
              uVar30 = uVar14 & 0xffffffff;
              for (uVar16 = 0; iVar20 = (int)uVar30, uVar16 != uVar28; uVar16 = uVar16 + 1) {
                uVar2 = *(uint *)((long)__ptr +
                                 (long)((int)uVar16 * iVar27 + (int)uVar14) * 4 + lVar25);
                if (uVar2 != 0) {
                  uVar23 = uVar10;
                  lVar26 = local_60;
                  while (bVar31 = uVar23 != 0, uVar23 = uVar23 - 1, bVar31) {
                    uVar3 = *(uint *)((long)__ptr + (lVar26 >> 0x1e) + lVar11 * 4);
                    if ((uVar3 != 0) &&
                       (uVar4 = *(uint *)((long)__ptr + (long)(int)uVar30 * 4), uVar4 != 0)) {
                      dVar37 = (double)uVar4;
                      dVar33 = log2(((double)uVar1 * dVar37) / ((double)uVar3 * (double)uVar2));
                      dVar32 = dVar32 + dVar33 * dVar37;
                    }
                    lVar26 = lVar26 + (uVar12 << 0x20);
                    uVar30 = (ulong)(uint)((int)uVar30 + (int)lVar29);
                  }
                }
                uVar30 = (ulong)(uint)(iVar20 + iVar27);
              }
            }
            local_60 = local_60 + 0x100000000;
          }
          free(__ptr);
          auVar36._0_8_ = (double)CONCAT44(0x43300000,(int)n_00);
          auVar36._8_4_ = (int)(n_00 >> 0x20);
          auVar36._12_4_ = 0x45300000;
          return dVar32 / ((auVar36._8_8_ - 1.9342813113834067e+25) +
                          (auVar36._0_8_ - 4503599627370496.0));
        }
      }
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
        return NAN;
      }
      return NAN;
    }
    piVar9 = back + lVar11;
    if (b <= *piVar9) goto LAB_001042b8;
  }
LAB_0010427e:
  if (err == (inform_error *)0x0) {
    return NAN;
  }
  iVar5 = INFORM_ENEGSTATE;
LAB_001041d6:
  *err = iVar5;
  return NAN;
}

Assistant:

double inform_information_flow(int const *src, int const *dst, int const *back,
    size_t l_src, size_t l_dst, size_t l_back, size_t n, size_t m, int b,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l_src, l_dst, l_back, n, m, b, err))
    {
        return NAN;
    }

    if (back == NULL || l_back == 0)
    {
        return mutual_info(src, dst, l_src, l_dst, n, m, b, err);
    }

    size_t const N = n * m;

    size_t const a_size = pow((double) b, (double) l_src);
    size_t const b_size = pow((double) b, (double) l_dst);
    size_t const s_size = pow((double) b, (double) l_back);

    size_t const joint_size = a_size * b_size * s_size;
    size_t const as_size = a_size * s_size;
    size_t const bs_size = b_size * s_size;

    size_t const total_size = joint_size + as_size + bs_size + s_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist joint = { data, joint_size, N };
    inform_dist as    = { data + joint_size, as_size, N };
    inform_dist bs    = { data + joint_size + as_size, bs_size, N };
    inform_dist s     = { data + joint_size + as_size + bs_size, s_size, N };

    accumulate_observations(src, dst, back, l_src, l_dst, l_back, n, m, b,
        &joint, &as, &bs, &s);

    double flow = 0.0;
    int bs_state, as_state, joint_state;
    double ns, nbs, nas, njoint;
    for (int s_state = 0; s_state < (int) s_size; ++s_state)
    {
        ns = s.histogram[s_state];
        if (ns == 0)
        {
            continue;
        }
        for (int b_state = 0; b_state < (int) b_size; ++b_state)
        {
            bs_state = b_state * s_size + s_state;
            nbs = bs.histogram[bs_state];
            if (nbs == 0)
            {
                continue;
            }
            for (int a_state = 0; a_state < (int) a_size; ++a_state)
            {
                as_state = a_state * s_size + s_state;
                nas = as.histogram[as_state];
                if (nas == 0)
                {
                    continue;
                }
                joint_state = a_state * bs_size + bs_state;
                njoint = joint.histogram[joint_state];
                if (njoint == 0)
                {
                    continue;
                }
                flow += njoint * log2((njoint * ns) / (nas * nbs));
            }
        }
    }

    free(data);

    return flow / N;
}